

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_file.cpp
# Opt level: O3

ssize_t libtorrent::aux::anon_unknown_1::copy_range
                  (int fd_in,int fd_out,off_t in_offset,int64_t len,copy_range_mode *m,
                  storage_error *se)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  off_t out_offset;
  off_t local_48;
  copy_range_mode *local_40;
  off_t local_38;
  
  local_48 = in_offset;
  if (m->use_fallback == true) {
    sVar2 = copy_range_fallback(fd_in,fd_out,in_offset,len,se);
    return sVar2;
  }
  lVar5 = 0;
  local_40 = m;
  local_38 = in_offset;
  while( true ) {
    lVar3 = copy_file_range(fd_in,&local_48,fd_out,&local_38,len,0);
    if (lVar3 < 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      if ((iVar1 == 0x5f) || (iVar1 == 0x12)) {
        local_40->use_fallback = true;
        sVar2 = copy_range_fallback(fd_in,fd_out,local_48,len,se);
      }
      else {
        se->operation = file_copy;
        (se->ec).val_ = iVar1;
        (se->ec).failed_ = iVar1 != 0;
        (se->ec).cat_ =
             &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
        ;
        sVar2 = -1;
      }
      return sVar2;
    }
    lVar5 = lVar5 + lVar3;
    if (lVar3 == 0) break;
    len = len - lVar3;
    if (len < 1) {
      return lVar5;
    }
  }
  return lVar5;
}

Assistant:

ssize_t copy_range(int const fd_in, int const fd_out, off_t in_offset
	, std::int64_t len, copy_range_mode* const m, storage_error& se)
{
#if TORRENT_HAS_COPY_FILE_RANGE
	if (m->use_fallback)
		return copy_range_fallback(fd_in, fd_out, in_offset, len, se);

	ssize_t total_copied = 0;
	off_t out_offset = in_offset;
	ssize_t ret = 0;
	do
	{
		ret = ::copy_file_range(fd_in, &in_offset
			, fd_out, &out_offset, std::size_t(len), 0);
		if (ret < 0)
		{
			int const err = errno;
			if (err == EXDEV || err == ENOTSUP)
			{
				m->use_fallback = true;
				return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
			}
			se.operation = operation_t::file_copy;
			se.ec.assign(err, system_category());
			return -1;
		}

		len -= ret;
		total_copied += ret;
	} while (len > 0 && ret > 0);
	return total_copied;
#else
	TORRENT_UNUSED(m);
	return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
#endif
}